

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChCollisionModel::AddConvexHullsFromFile
          (ChCollisionModel *this,shared_ptr<chrono::ChMaterialSurface> *material,
          ChStreamInAscii *mstream,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  char cVar1;
  int iVar2;
  ChException *this_00;
  long lVar3;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> ptlist;
  float vz;
  float vy;
  float vx;
  char bufdata [200];
  void *local_198;
  void *pvStack_190;
  long local_188;
  float local_17c;
  float local_178;
  float local_174;
  shared_ptr<chrono::ChMaterialSurface> *local_170;
  ChCollisionModel *local_168;
  ChVector<double> *local_160;
  ChMatrix33<double> *local_158;
  element_type *local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  element_type *local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  ChVector<double> local_130;
  string local_118;
  undefined4 local_f8;
  char local_f4;
  
  local_198 = (void *)0x0;
  pvStack_190 = (void *)0x0;
  local_188 = 0;
  local_170 = material;
  local_168 = this;
  local_160 = pos;
  local_158 = rot;
  do {
    iVar2 = (*(mstream->super_ChStreamIn)._vptr_ChStreamIn[2])(mstream);
    if ((char)iVar2 != '\0') {
      if (pvStack_190 != local_198) {
        local_150 = (local_170->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        local_148 = (local_170->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
        if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_148->_M_use_count = local_148->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_148->_M_use_count = local_148->_M_use_count + 1;
          }
        }
        (*local_168->_vptr_ChCollisionModel[0xf])
                  (local_168,&local_150,&local_198,local_160,local_158);
        if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
        }
      }
      if (pvStack_190 != local_198) {
        pvStack_190 = local_198;
      }
      if (local_198 != (void *)0x0) {
        operator_delete(local_198,local_188 - (long)local_198);
      }
      return true;
    }
    lVar3 = 0;
    while( true ) {
      iVar2 = (*(mstream->super_ChStreamIn)._vptr_ChStreamIn[2])(mstream);
      if ((char)iVar2 != '\0') break;
      (*(mstream->super_ChStreamIn)._vptr_ChStreamIn[5])(mstream,(char *)((long)&local_f8 + lVar3));
      cVar1 = *(char *)((long)&local_f8 + lVar3);
      if ((cVar1 == '\r') || (cVar1 == '\n')) {
        *(undefined1 *)((long)&local_f8 + lVar3) = 0;
        break;
      }
      lVar3 = lVar3 + 1;
      if (lVar3 == 200) {
        this_00 = (ChException *)__cxa_allocate_exception(0x28);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"Too long line in parsing","");
        ChException::ChException(this_00,&local_118);
        __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
      }
    }
    *(undefined1 *)((long)&local_f8 + lVar3 + 1) = 0;
    if (local_f4 == '\0' && local_f8 == 0x6c6c7568) {
      if (pvStack_190 != local_198) {
        local_140 = (local_170->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        local_138 = (local_170->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
        if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_138->_M_use_count = local_138->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_138->_M_use_count = local_138->_M_use_count + 1;
          }
        }
        (*local_168->_vptr_ChCollisionModel[0xf])
                  (local_168,&local_140,&local_198,local_160,local_158);
        if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
        }
      }
      if (pvStack_190 != local_198) {
        pvStack_190 = local_198;
      }
    }
    iVar2 = __isoc99_sscanf(&local_f8,"%g %g %g",&local_174,&local_178,&local_17c);
    if (iVar2 == 3) {
      local_130.m_data[0] = (double)local_174;
      local_130.m_data[1] = (double)local_178;
      local_130.m_data[2] = (double)local_17c;
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      emplace_back<chrono::ChVector<double>>
                ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                 &local_198,&local_130);
    }
  } while( true );
}

Assistant:

bool ChCollisionModel::AddConvexHullsFromFile(std::shared_ptr<ChMaterialSurface> material,
                                              ChStreamInAscii& mstream,
                                              const ChVector<>& pos,
                                              const ChMatrix33<>& rot) {
    std::vector<ChVector<double> > ptlist;

    char bufdata[200];
    int linechar = 0;
    while (!mstream.End_of_stream()) {
        // read one line
        linechar = 0;
        while (!mstream.End_of_stream()) {
            try {
                mstream >> bufdata[linechar];
            } catch (const ChException &) {
            };
            if ((bufdata[linechar] == (char)13) || (bufdata[linechar] == (char)10)) {
                bufdata[linechar] = 0;
                break;
            }
            linechar++;
            if (linechar >= 200)
                throw(ChException("Too long line in parsing"));
        }
        bufdata[linechar + 1] = 0;

        ////bool parsedline = false;
        if (bufdata[0] != *"#") {
            ////parsedline = true;
        }
        if (strcmp(bufdata, "hull") == 0) {
            if (ptlist.size())
                this->AddConvexHull(material, ptlist, pos, rot);
            ptlist.clear();
            ////parsedline = true;
        }
        float vx, vy, vz;
        if (sscanf(bufdata, "%g %g %g", &vx, &vy, &vz) == 3) {
            ptlist.push_back(ChVector<>(vx, vy, vz));
            ////parsedline = true;
        }
    }
    
    if (ptlist.size())
        this->AddConvexHull(material, ptlist, pos, rot);
    ptlist.clear();

    return true;
}